

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# poll.c
# Opt level: O0

void * poll_init(event_base *base)

{
  pollop *pollop;
  event_base *base_local;
  
  base_local = (event_base *)event_mm_calloc_(1,0x20);
  if (base_local == (event_base *)0x0) {
    base_local = (event_base *)0x0;
  }
  else {
    evsig_init_(base);
    evutil_weakrand_seed_(&base->weakrand_seed,0);
  }
  return base_local;
}

Assistant:

static void *
poll_init(struct event_base *base)
{
	struct pollop *pollop;

	if (!(pollop = mm_calloc(1, sizeof(struct pollop))))
		return (NULL);

	evsig_init_(base);

	evutil_weakrand_seed_(&base->weakrand_seed, 0);

	return (pollop);
}